

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O1

void __thiscall OpenSketch<4U>::Init(OpenSketch<4U> *this,Data<4U> *from,Data<4U> *to)

{
  HashMap<4U> *this_00;
  byte *pbVar1;
  int iVar2;
  uchar *puVar3;
  KV<4U> *pKVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  uint position;
  int iVar11;
  uint uVar12;
  mapped_type i_00;
  KV<4U> *kv;
  uint8_t *data;
  int i;
  uint uVar13;
  Stream<4U> stream;
  undefined4 local_2c;
  
  local_2c = *(undefined4 *)to->str;
  uVar13 = 0;
  uVar7 = Hash::BOBHash32((uchar *)&local_2c,4,0);
  uVar5 = (ulong)uVar7 % (ulong)*(uint *)&(this->super_Abstract<4U>).field_0x6c;
  uVar6 = uVar5 >> 3;
  uVar12 = 1 << ((byte)uVar5 & 7);
  iVar11 = 0x7fffffff;
  do {
    uVar8 = (*(int *)from->str * 0x16a88000 | (uint)(*(int *)from->str * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ uVar13;
    uVar8 = (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64;
    uVar8 = (uVar8 >> 0x10 ^ uVar8 ^ 4) * -0x7a143595;
    uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    uVar5 = (ulong)(uVar8 >> 0x10 ^ uVar8) % (ulong)(uint)this->COLUMN;
    puVar3 = this->bitset[uVar5].bitset;
    if ((uVar12 & puVar3[uVar6]) == 0) {
      this->counter[uVar5] = this->counter[uVar5] + 1;
      pbVar1 = puVar3 + uVar6;
      *pbVar1 = *pbVar1 | (byte)uVar12;
    }
    if (this->counter[uVar5] <= iVar11) {
      iVar11 = this->counter[uVar5];
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 == 1);
  this_00 = &this->mp;
  iVar9 = std::
          _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,from);
  if (iVar9.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
      (__node_type *)0x0) {
    pKVar4 = this->heap;
    if (this->heap_num < this->CAPACITY) {
      *(undefined4 *)pKVar4[this->heap_num].second.str = *(undefined4 *)from->str;
      iVar2 = this->heap_num;
      this->heap[iVar2].first = iVar11;
      this->heap_num = iVar2 + 1;
      pmVar10 = std::__detail::
                _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,from);
      *pmVar10 = iVar2;
      heap_up(this,this->heap_num + -1);
      return;
    }
    if (iVar11 <= pKVar4->first) {
      return;
    }
    std::
    _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&this_00->_M_h,&pKVar4->second);
    *(undefined4 *)(pKVar4->second).str = *(undefined4 *)from->str;
    pKVar4->first = iVar11;
    pmVar10 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    *pmVar10 = 0;
    i_00 = 0;
  }
  else {
    pKVar4 = this->heap;
    pmVar10 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    if (pKVar4[*pmVar10].first == iVar11) {
      return;
    }
    pKVar4 = this->heap;
    pmVar10 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    pKVar4[*pmVar10].first = iVar11;
    pmVar10 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,from);
    i_00 = *pmVar10;
  }
  heap_down(this,i_00);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& from, const Data<DATA_LEN>& to) {
		Stream<DATA_LEN> stream(from, to);

		int min_num = INT_MAX;
		uint index = Hash::BOBHash32(stream.str + DATA_LEN, DATA_LEN) % LENGTH;
		for (int i = 0; i < 2; ++i) {
			uint pos = from.Hash(i) % COLUMN;
			if (!bitset[pos].Get(index)) {
				counter[pos] += 1;
				bitset[pos].Set(index);
			}
			min_num = MIN(min_num, counter[pos]);
		}

		if (mp.find(from) != mp.end()) {
			if (heap[mp[from]].first != min_num) {
				heap[mp[from]].first = min_num;
				heap_down(mp[from]);
			}
		}
		else if (heap_num < CAPACITY) {
			heap[heap_num].second = from;
			heap[heap_num].first = min_num;
			mp[from] = heap_num++;
			heap_up(heap_num - 1);
		}
		else if (min_num > heap[0].first) {
			KV<DATA_LEN>& kv = heap[0];
			mp.erase(kv.second);
			kv.second = from;
			kv.first = min_num;
			mp[from] = 0;
			heap_down(0);
		}
	}